

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O1

void calc_similarity(double *numeric_data,int *categ_data,double *Xc,int64_t *Xc_ind,
                    int64_t *Xc_indptr,size_t nrows,bool use_long_double,int nthreads,
                    bool assume_full_distr,bool standardize_dist,bool as_kernel,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *tmat,
                    double *rmat,size_t n_from,bool use_indexed_references,TreesIndexer *indexer,
                    bool is_col_major,size_t ld_numeric,size_t ld_categ)

{
  if (use_long_double) {
    calc_similarity_internal<double,long,long_double>
              (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
               standardize_dist,as_kernel,model_outputs,model_outputs_ext,tmat,rmat,n_from,
               use_indexed_references,indexer,is_col_major,ld_numeric,ld_categ);
  }
  else {
    calc_similarity_internal<double,long,double>
              (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
               standardize_dist,as_kernel,model_outputs,model_outputs_ext,tmat,rmat,n_from,
               use_indexed_references,indexer,is_col_major,ld_numeric,ld_categ);
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void calc_similarity(real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, bool use_long_double, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    calc_similarity<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     Xc, Xc_ind, Xc_indptr,
                     nrows, use_long_double, nthreads,
                     assume_full_distr, standardize_dist, as_kernel,
                     model_outputs, model_outputs_ext,
                     tmat, rmat, n_from, use_indexed_references,
                     indexer, is_col_major, ld_numeric, ld_categ);
}